

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

vbool<4> __thiscall
embree::sse42::InstanceArrayIntersectorK<4>::occluded
          (InstanceArrayIntersectorK<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  uint uVar2;
  RTCFormat RVar3;
  InstanceArray *this_00;
  RTCRayQueryContext *pRVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar13;
  undefined1 auVar14 [12];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar26;
  uint auVar27 [1];
  uint auVar33 [1];
  float fVar34;
  undefined1 auVar30 [16];
  float fVar28;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar38;
  float fVar39;
  undefined1 in_XMM2 [16];
  vfloat4 l02;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  float fVar44;
  float fVar46;
  vfloat4 v_1;
  undefined1 auVar42 [16];
  float fVar45;
  float fVar47;
  undefined1 auVar43 [16];
  float fVar48;
  float fVar53;
  float fVar54;
  undefined1 in_XMM4 [16];
  vfloat4 v;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [12];
  undefined1 in_XMM6 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 in_XMM8 [16];
  vfloat4 a0;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 in_XMM11 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  vbool<4> vVar79;
  RayQueryContext newcontext;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_58 [16];
  Accel *local_48;
  RTCRayQueryContext *local_40;
  RTCIntersectArguments *local_38;
  RTCRayQueryContext RVar29;
  undefined1 auVar49 [16];
  
  auVar59 = in_XMM6._0_12_;
  aVar13 = valid_i->field_0;
  uVar22 = prim->instID_;
  this_00 = (InstanceArray *)(context->scene->geometries).items[uVar22].ptr;
  local_48 = InstanceArray::getObject(this_00,(ulong)prim->primID_);
  uVar15 = mm_lookupmask_ps._8_8_;
  uVar26 = extraout_RDX;
  if (local_48 != (Accel *)0x0) {
    uVar2 = (this_00->super_Geometry).mask;
    auVar31._0_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x90)) == 0);
    auVar31._4_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x94)) == 0);
    auVar31._8_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x98)) == 0);
    auVar31._12_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x9c)) == 0);
    local_58 = ~auVar31 & (undefined1  [16])aVar13;
    iVar23 = movmskps(uVar22,local_58);
    if (iVar23 != 0) {
      pRVar4 = context->user;
      *(undefined8 *)this = mm_lookupmask_ps._0_8_;
      *(undefined8 *)(this + 8) = uVar15;
      if (pRVar4->instID[0] == 0xffffffff) {
        auVar27[0] = (*prim).primID_;
        auVar33[0] = (*prim).instID_;
        RVar29.instPrimID[0] = auVar27[0];
        RVar29.instID[0] = auVar33[0];
        auVar57._8_8_ = 0;
        auVar57._0_4_ = (float)auVar33[0];
        auVar57._4_4_ = (float)auVar27[0];
        *pRVar4 = RVar29;
        uVar24 = (ulong)prim->primID_;
        pRVar5 = (this_00->l2w_buf).items;
        RVar3 = pRVar5->format;
        if ((this_00->super_Geometry).field_8.field_0x1 == '\x01') {
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar25 = uVar24 * pRVar5->stride;
            auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25)),
                               *(undefined4 *)(pcVar6 + lVar25 + 0x10),0x1c);
            auVar57 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x20),0x28);
            auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 4)),
                               *(undefined4 *)(pcVar6 + lVar25 + 0x14),0x1c);
            in_XMM2 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x24),0x28);
            auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 8)),
                               *(undefined4 *)(pcVar6 + lVar25 + 0x18),0x1c);
            in_XMM11 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x28),0x28);
            auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 0xc)),
                               *(undefined4 *)(pcVar6 + lVar25 + 0x1c),0x1c);
            in_XMM4 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x2c),0x28);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar25 = uVar24 * pRVar5->stride;
            auVar57._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar25 + 4);
            auVar57._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar25);
            auVar57._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 4) >> 0x20);
            auVar57._12_4_ = 0.0;
            in_XMM2._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x10);
            in_XMM2._0_4_ = *(undefined4 *)(pcVar6 + lVar25 + 0xc);
            in_XMM2._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x10) >> 0x20);
            in_XMM2._12_4_ = 0;
            in_XMM11._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x1c);
            in_XMM11._0_4_ = *(undefined4 *)(pcVar6 + lVar25 + 0x18);
            in_XMM11._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x1c) >> 0x20);
            in_XMM11._12_4_ = 0;
            in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x28);
            in_XMM4._0_4_ = *(undefined4 *)(pcVar6 + lVar25 + 0x24);
            in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x28) >> 0x20);
            in_XMM4._12_4_ = 0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar25 = uVar24 * pRVar5->stride;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(pcVar6 + lVar25 + 0x10);
            auVar74 = insertps(auVar74,*(undefined4 *)(pcVar6 + lVar25 + 8),0x20);
            auVar51._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x34);
            auVar51._0_4_ = *(undefined4 *)(pcVar6 + lVar25);
            auVar51._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x34) >> 0x20);
            auVar51._12_4_ = 0;
            auVar52._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x1c);
            auVar52._0_4_ = *(undefined4 *)(pcVar6 + lVar25 + 0x18);
            auVar52._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x1c) >> 0x20);
            auVar52._12_4_ = 0;
            fVar28 = *(float *)(pcVar6 + lVar25 + 0x24);
            fVar41 = *(float *)(pcVar6 + lVar25 + 0x28);
            fVar34 = *(float *)(pcVar6 + lVar25 + 0x2c);
            fVar44 = *(float *)(pcVar6 + lVar25 + 0x30);
            fVar62 = fVar44 * fVar44 + fVar34 * fVar34 + fVar28 * fVar28 + fVar41 * fVar41;
            auVar31 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
            fVar46 = auVar31._0_4_;
            auVar43._4_12_ = auVar31._4_12_;
            fVar46 = fVar46 * fVar46 * fVar62 * -0.5 * fVar46 + fVar46 * 1.5;
            in_XMM4 = insertps(auVar52,ZEXT416((uint)(fVar28 * fVar46)),0x30);
            auVar57 = insertps(auVar51,ZEXT416((uint)(fVar41 * fVar46)),0x30);
            auVar43._0_4_ = fVar46 * fVar44;
            auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 0xc)),
                               *(undefined4 *)(pcVar6 + lVar25 + 4),0x10);
            in_XMM11 = insertps(auVar74,auVar43,0x30);
            auVar31 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x3c),0x20);
            in_XMM2 = insertps(auVar31,ZEXT416((uint)(fVar34 * fVar46)),0x30);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar25 = uVar24 * pRVar5->stride;
            auVar57 = *(undefined1 (*) [16])(pcVar6 + lVar25);
            in_XMM2 = *(undefined1 (*) [16])(pcVar6 + lVar25 + 0x10);
            in_XMM11 = *(undefined1 (*) [16])(pcVar6 + lVar25 + 0x20);
            in_XMM4 = *(undefined1 (*) [16])(pcVar6 + lVar25 + 0x30);
          }
          fVar62 = in_XMM4._12_4_;
          fVar28 = auVar57._0_4_;
          fVar41 = auVar57._12_4_;
          fVar34 = in_XMM2._4_4_;
          fVar44 = in_XMM2._12_4_;
          fVar58 = in_XMM11._12_4_;
          fVar75 = fVar41 * fVar44 + fVar58 * fVar62;
          fVar61 = fVar41 * fVar44 - fVar58 * fVar62;
          fVar65 = fVar62 * fVar62 + fVar41 * fVar41 + -fVar44 * fVar44 + -fVar58 * fVar58;
          fVar77 = fVar62 * fVar62 - fVar41 * fVar41;
          fVar73 = fVar44 * fVar44 + fVar77 + -fVar58 * fVar58;
          fVar78 = fVar41 * fVar58 - fVar44 * fVar62;
          fVar46 = fVar44 * fVar62 + fVar41 * fVar58;
          fVar76 = fVar44 * fVar58 + fVar41 * fVar62;
          fVar63 = fVar44 * fVar58 - fVar41 * fVar62;
          fVar75 = fVar75 + fVar75;
          fVar78 = fVar78 + fVar78;
          fVar58 = fVar58 * fVar58 + fVar77 + -fVar44 * fVar44;
          fVar66 = fVar65 * 1.0 + fVar75 * 0.0 + fVar78 * 0.0;
          fVar69 = fVar65 * 0.0 + fVar75 * 1.0 + fVar78 * 0.0;
          fVar71 = fVar65 * 0.0 + fVar75 * 0.0 + fVar78 * 1.0;
          fVar78 = fVar65 * 0.0 + fVar75 * 0.0 + fVar78 * 0.0;
          fVar76 = fVar76 + fVar76;
          fVar61 = fVar61 + fVar61;
          fVar65 = fVar61 * 1.0 + fVar73 * 0.0 + fVar76 * 0.0;
          fVar75 = fVar61 * 0.0 + fVar73 * 1.0 + fVar76 * 0.0;
          fVar77 = fVar61 * 0.0 + fVar73 * 0.0 + fVar76 * 1.0;
          fVar61 = fVar61 * 0.0 + fVar73 * 0.0 + fVar76 * 0.0;
          auVar72._0_8_ = auVar57._4_8_;
          auVar72._8_8_ = 0;
          auVar31 = blendps(auVar72,in_XMM2,4);
          fVar46 = fVar46 + fVar46;
          fVar63 = fVar63 + fVar63;
          fVar41 = fVar46 * 1.0 + fVar63 * 0.0 + fVar58 * 0.0;
          fVar44 = fVar46 * 0.0 + fVar63 * 1.0 + fVar58 * 0.0;
          fVar62 = fVar46 * 0.0 + fVar63 * 0.0 + fVar58 * 1.0;
          fVar46 = fVar46 * 0.0 + fVar63 * 0.0 + fVar58 * 0.0;
          local_a8._0_4_ = in_XMM11._0_4_;
          local_a8._4_4_ = in_XMM11._4_4_;
          uStack_a0._0_4_ = in_XMM11._8_4_;
          local_b8._0_4_ = in_XMM4._0_4_;
          local_b8._4_4_ = in_XMM4._4_4_;
          uStack_b0._0_4_ = in_XMM4._8_4_;
          fVar58 = fVar46 * 0.0;
          auVar57._0_4_ = fVar28 * fVar66 + fVar65 * 0.0 + fVar41 * 0.0;
          auVar57._4_4_ = fVar28 * fVar69 + fVar75 * 0.0 + fVar44 * 0.0;
          auVar57._8_4_ = fVar28 * fVar71 + fVar77 * 0.0 + fVar62 * 0.0;
          auVar57._12_4_ = fVar28 * fVar78 + fVar61 * 0.0 + fVar58;
          fVar28 = in_XMM2._0_4_;
          in_XMM8._0_4_ = fVar28 * fVar66 + fVar34 * fVar65 + fVar41 * 0.0;
          in_XMM8._4_4_ = fVar28 * fVar69 + fVar34 * fVar75 + fVar44 * 0.0;
          in_XMM8._8_4_ = fVar28 * fVar71 + fVar34 * fVar77 + fVar62 * 0.0;
          in_XMM8._12_4_ = fVar28 * fVar78 + fVar34 * fVar61 + fVar58;
          in_XMM5._0_4_ =
               (float)local_a8 * fVar66 + local_a8._4_4_ * fVar65 + (float)uStack_a0 * fVar41;
          in_XMM5._4_4_ =
               (float)local_a8 * fVar69 + local_a8._4_4_ * fVar75 + (float)uStack_a0 * fVar44;
          in_XMM5._8_4_ =
               (float)local_a8 * fVar71 + local_a8._4_4_ * fVar77 + (float)uStack_a0 * fVar62;
          in_XMM5._12_4_ =
               (float)local_a8 * fVar78 + local_a8._4_4_ * fVar61 + (float)uStack_a0 * fVar46;
          auVar59._0_4_ =
               (float)local_b8 * fVar66 + local_b8._4_4_ * fVar65 + (float)uStack_b0 * fVar41 +
               auVar31._0_4_ + 0.0;
          auVar59._4_4_ =
               (float)local_b8 * fVar69 + local_b8._4_4_ * fVar75 + (float)uStack_b0 * fVar44 +
               auVar31._4_4_ + 0.0;
          auVar59._8_4_ =
               (float)local_b8 * fVar71 + local_b8._4_4_ * fVar77 + (float)uStack_b0 * fVar62 +
               auVar31._8_4_ + 0.0;
        }
        else if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar25 = uVar24 * pRVar5->stride;
          auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25)),
                             *(undefined4 *)(pcVar6 + lVar25 + 0x10),0x1c);
          auVar57 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x20),0x28);
          auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 4)),
                             *(undefined4 *)(pcVar6 + lVar25 + 0x14),0x1c);
          in_XMM8 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x24),0x28);
          auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 8)),
                             *(undefined4 *)(pcVar6 + lVar25 + 0x18),0x1c);
          in_XMM5 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x28),0x28);
          auVar31 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 0xc)),
                             *(undefined4 *)(pcVar6 + lVar25 + 0x1c),0x1c);
          auVar31 = insertps(auVar31,*(undefined4 *)(pcVar6 + lVar25 + 0x2c),0x28);
          auVar59 = auVar31._0_12_;
        }
        else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar25 = uVar24 * pRVar5->stride;
          auVar57._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar25 + 4);
          auVar57._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar25);
          auVar57._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 4) >> 0x20);
          auVar57._12_4_ = 0.0;
          in_XMM8._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar25 + 0x10);
          in_XMM8._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar25 + 0xc);
          in_XMM8._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x10) >> 0x20);
          in_XMM8._12_4_ = 0.0;
          in_XMM5._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar25 + 0x1c);
          in_XMM5._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar25 + 0x18);
          in_XMM5._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x1c) >> 0x20);
          in_XMM5._12_4_ = 0.0;
          auVar59._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar25 + 0x28);
          auVar59._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar25 + 0x24);
          auVar59._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x28) >> 0x20);
        }
        else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar25 = uVar24 * pRVar5->stride;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(pcVar6 + lVar25 + 0x10);
          auVar31 = insertps(auVar55,*(undefined4 *)(pcVar6 + lVar25 + 8),0x20);
          auVar30._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x34);
          auVar30._0_4_ = *(undefined4 *)(pcVar6 + lVar25);
          auVar30._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x34) >> 0x20);
          auVar30._12_4_ = 0;
          auVar60._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar25 + 0x1c);
          auVar60._0_4_ = *(undefined4 *)(pcVar6 + lVar25 + 0x18);
          auVar60._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar25 + 0x1c) >> 0x20);
          auVar60._12_4_ = 0;
          fVar28 = *(float *)(pcVar6 + lVar25 + 0x24);
          fVar41 = *(float *)(pcVar6 + lVar25 + 0x28);
          fVar34 = *(float *)(pcVar6 + lVar25 + 0x2c);
          fVar44 = *(float *)(pcVar6 + lVar25 + 0x30);
          fVar62 = fVar44 * fVar44 + fVar34 * fVar34 + fVar28 * fVar28 + fVar41 * fVar41;
          auVar57 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
          fVar46 = auVar57._0_4_;
          auVar67._4_12_ = auVar57._4_12_;
          fVar46 = fVar46 * fVar46 * fVar62 * -0.5 * fVar46 + fVar46 * 1.5;
          auVar57 = insertps(auVar60,ZEXT416((uint)(fVar28 * fVar46)),0x30);
          auVar59 = auVar57._0_12_;
          auVar57 = insertps(auVar30,ZEXT416((uint)(fVar41 * fVar46)),0x30);
          auVar67._0_4_ = fVar46 * fVar44;
          auVar51 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar25 + 0xc)),
                             *(undefined4 *)(pcVar6 + lVar25 + 4),0x10);
          in_XMM5 = insertps(auVar31,auVar67,0x30);
          auVar31 = insertps(auVar51,*(undefined4 *)(pcVar6 + lVar25 + 0x3c),0x20);
          in_XMM8 = insertps(auVar31,ZEXT416((uint)(fVar34 * fVar46)),0x30);
        }
        else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar25 = uVar24 * pRVar5->stride;
          auVar57 = *(undefined1 (*) [16])(pcVar6 + lVar25);
          in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar25 + 0x10);
          in_XMM5 = *(undefined1 (*) [16])(pcVar6 + lVar25 + 0x20);
          auVar59 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar25 + 0x30),0);
        }
        fVar62 = in_XMM5._0_4_;
        fVar58 = in_XMM5._4_4_;
        fVar61 = in_XMM5._8_4_;
        fVar65 = in_XMM5._12_4_;
        fVar75 = in_XMM8._0_4_;
        fVar77 = in_XMM8._4_4_;
        fVar63 = in_XMM8._8_4_;
        fVar28 = auVar57._0_4_;
        fVar41 = auVar57._4_4_;
        fVar34 = auVar57._8_4_;
        auVar42._0_4_ = fVar75 * fVar58 - fVar77 * fVar62;
        fVar44 = fVar77 * fVar61 - fVar63 * fVar58;
        fVar46 = fVar63 * fVar62 - fVar75 * fVar61;
        auVar36._4_4_ = fVar46;
        auVar36._0_4_ = fVar44;
        auVar36._8_4_ = auVar42._0_4_;
        auVar36._12_4_ = in_XMM8._12_4_ * fVar65 - in_XMM8._12_4_ * fVar65;
        auVar56._0_4_ = fVar62 * fVar41 - fVar58 * fVar28;
        auVar56._4_4_ = fVar58 * fVar34 - fVar61 * fVar41;
        auVar56._8_4_ = fVar61 * fVar28 - fVar62 * fVar34;
        auVar56._12_4_ = fVar65 * auVar57._12_4_ - fVar65 * auVar57._12_4_;
        fVar62 = fVar41 * fVar63 - fVar34 * fVar77;
        auVar31 = dpps(auVar57,auVar36,0x7f);
        auVar57 = insertps(auVar56,auVar56,0x4a);
        auVar42._4_4_ = auVar56._0_4_;
        auVar42._8_4_ = fVar28 * fVar77 - fVar41 * fVar75;
        auVar42._12_4_ = 0;
        auVar50._4_4_ = fVar62;
        auVar50._0_4_ = fVar44;
        auVar50._8_4_ = fVar62;
        auVar50._12_4_ = auVar57._4_4_;
        auVar49._8_8_ = auVar50._8_8_;
        auVar49._4_4_ = auVar57._0_4_;
        auVar49._0_4_ = fVar44;
        auVar37._4_4_ = auVar57._8_4_;
        auVar37._0_4_ = fVar46;
        auVar37._8_4_ = fVar34 * fVar75 - fVar28 * fVar63;
        auVar37._12_4_ = auVar57._12_4_;
        auVar32._0_4_ = auVar31._0_4_;
        auVar32._4_4_ = auVar32._0_4_;
        auVar32._8_4_ = auVar32._0_4_;
        auVar32._12_4_ = auVar32._0_4_;
        auVar51 = divps(auVar49,auVar32);
        auVar31 = divps(auVar37,auVar32);
        auVar57 = divps(auVar42,auVar32);
        fVar28 = auVar59._0_4_;
        fVar41 = auVar59._4_4_;
        fVar34 = auVar59._8_4_;
        fVar40 = auVar57._0_4_;
        fVar45 = auVar57._4_4_;
        fVar47 = auVar57._8_4_;
        fVar35 = auVar31._0_4_;
        fVar38 = auVar31._4_4_;
        fVar39 = auVar31._8_4_;
        fVar48 = auVar51._0_4_;
        fVar53 = auVar51._4_4_;
        fVar54 = auVar51._8_4_;
        fVar64 = fVar28 * fVar48 + fVar41 * fVar35 + fVar34 * fVar40;
        fVar68 = fVar28 * fVar53 + fVar41 * fVar38 + fVar34 * fVar45;
        fVar70 = fVar28 * fVar54 + fVar41 * fVar39 + fVar34 * fVar47;
        fVar28 = *(float *)ray;
        fVar41 = *(float *)(ray + 4);
        uVar15 = *(undefined8 *)ray;
        fVar34 = *(float *)(ray + 8);
        fVar44 = *(float *)(ray + 0xc);
        uVar26 = *(undefined8 *)(ray + 8);
        pRVar1 = ray + 0x10;
        fVar46 = *(float *)pRVar1;
        fVar62 = *(float *)(ray + 0x14);
        fVar58 = *(float *)(ray + 0x18);
        auVar59 = *(undefined1 (*) [12])pRVar1;
        fVar61 = *(float *)(ray + 0x1c);
        auVar31 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x20;
        fVar65 = *(float *)pRVar1;
        fVar75 = *(float *)(ray + 0x24);
        fVar77 = *(float *)(ray + 0x28);
        auVar14 = *(undefined1 (*) [12])pRVar1;
        fVar63 = *(float *)(ray + 0x2c);
        auVar57 = *(undefined1 (*) [16])pRVar1;
        fVar66 = *(float *)(ray + 0x40);
        fVar69 = *(float *)(ray + 0x44);
        uVar16 = *(undefined8 *)(ray + 0x40);
        fVar71 = *(float *)(ray + 0x48);
        fVar78 = *(float *)(ray + 0x4c);
        uVar17 = *(undefined8 *)(ray + 0x48);
        fVar73 = *(float *)(ray + 0x50);
        fVar76 = *(float *)(ray + 0x54);
        uVar18 = *(undefined8 *)(ray + 0x50);
        fVar7 = *(float *)(ray + 0x58);
        fVar8 = *(float *)(ray + 0x5c);
        uVar19 = *(undefined8 *)(ray + 0x58);
        fVar9 = *(float *)(ray + 0x60);
        fVar10 = *(float *)(ray + 100);
        uVar20 = *(undefined8 *)(ray + 0x60);
        fVar11 = *(float *)(ray + 0x68);
        fVar12 = *(float *)(ray + 0x6c);
        uVar21 = *(undefined8 *)(ray + 0x68);
        *(float *)ray = fVar28 * fVar48 + fVar46 * fVar35 + (fVar65 * fVar40 - fVar64);
        *(float *)(ray + 4) = fVar41 * fVar48 + fVar62 * fVar35 + (fVar75 * fVar40 - fVar64);
        *(float *)(ray + 8) = fVar34 * fVar48 + fVar58 * fVar35 + (fVar77 * fVar40 - fVar64);
        *(float *)(ray + 0xc) = fVar44 * fVar48 + fVar61 * fVar35 + (fVar63 * fVar40 - fVar64);
        *(float *)(ray + 0x10) = fVar28 * fVar53 + fVar46 * fVar38 + (fVar65 * fVar45 - fVar68);
        *(float *)(ray + 0x14) = fVar41 * fVar53 + fVar62 * fVar38 + (fVar75 * fVar45 - fVar68);
        *(float *)(ray + 0x18) = fVar34 * fVar53 + fVar58 * fVar38 + (fVar77 * fVar45 - fVar68);
        *(float *)(ray + 0x1c) = fVar44 * fVar53 + fVar61 * fVar38 + (fVar63 * fVar45 - fVar68);
        *(float *)(ray + 0x20) = fVar28 * fVar54 + fVar46 * fVar39 + (fVar65 * fVar47 - fVar70);
        *(float *)(ray + 0x24) = fVar41 * fVar54 + fVar62 * fVar39 + (fVar75 * fVar47 - fVar70);
        *(float *)(ray + 0x28) = fVar34 * fVar54 + fVar58 * fVar39 + (fVar77 * fVar47 - fVar70);
        *(float *)(ray + 0x2c) = fVar44 * fVar54 + fVar61 * fVar39 + (fVar63 * fVar47 - fVar70);
        *(float *)(ray + 0x40) = fVar48 * fVar66 + fVar35 * fVar73 + fVar40 * fVar9;
        *(float *)(ray + 0x44) = fVar48 * fVar69 + fVar35 * fVar76 + fVar40 * fVar10;
        *(float *)(ray + 0x48) = fVar48 * fVar71 + fVar35 * fVar7 + fVar40 * fVar11;
        *(float *)(ray + 0x4c) = fVar48 * fVar78 + fVar35 * fVar8 + fVar40 * fVar12;
        *(float *)(ray + 0x50) = fVar53 * fVar66 + fVar38 * fVar73 + fVar45 * fVar9;
        *(float *)(ray + 0x54) = fVar53 * fVar69 + fVar38 * fVar76 + fVar45 * fVar10;
        *(float *)(ray + 0x58) = fVar53 * fVar71 + fVar38 * fVar7 + fVar45 * fVar11;
        *(float *)(ray + 0x5c) = fVar53 * fVar78 + fVar38 * fVar8 + fVar45 * fVar12;
        *(float *)(ray + 0x60) = fVar54 * fVar66 + fVar39 * fVar73 + fVar47 * fVar9;
        *(float *)(ray + 100) = fVar54 * fVar69 + fVar39 * fVar76 + fVar47 * fVar10;
        *(float *)(ray + 0x68) = fVar54 * fVar71 + fVar39 * fVar7 + fVar47 * fVar11;
        *(float *)(ray + 0x6c) = fVar54 * fVar78 + fVar39 * fVar8 + fVar47 * fVar12;
        local_38 = context->args;
        local_40 = pRVar4;
        (**(code **)&local_48->field_0xa0)(local_58,&(local_48->super_AccelData).field_0x58,ray);
        *(undefined8 *)ray = uVar15;
        *(undefined8 *)(ray + 8) = uVar26;
        local_a8 = auVar59._0_8_;
        uStack_a0 = auVar31._8_8_;
        *(undefined8 *)(ray + 0x10) = local_a8;
        *(undefined8 *)(ray + 0x18) = uStack_a0;
        local_b8 = auVar14._0_8_;
        uStack_b0 = auVar57._8_8_;
        *(undefined8 *)(ray + 0x20) = local_b8;
        *(undefined8 *)(ray + 0x28) = uStack_b0;
        *(undefined8 *)(ray + 0x40) = uVar16;
        *(undefined8 *)(ray + 0x48) = uVar17;
        *(undefined8 *)(ray + 0x50) = uVar18;
        *(undefined8 *)(ray + 0x58) = uVar19;
        *(undefined8 *)(ray + 0x60) = uVar20;
        *(undefined8 *)(ray + 0x68) = uVar21;
        fVar28 = *(float *)(ray + 0x84);
        fVar41 = *(float *)(ray + 0x88);
        fVar34 = *(float *)(ray + 0x8c);
        *(uint *)this = -(uint)(*(float *)(ray + 0x80) < 0.0);
        *(uint *)(this + 4) = -(uint)(fVar28 < 0.0);
        *(uint *)(this + 8) = -(uint)(fVar41 < 0.0);
        *(uint *)(this + 0xc) = -(uint)(fVar34 < 0.0);
        pRVar4->instID[0] = 0xffffffff;
        pRVar4->instPrimID[0] = 0xffffffff;
        uVar26 = extraout_RDX_00;
      }
      goto LAB_00757bc0;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar15;
LAB_00757bc0:
  vVar79.field_0._8_8_ = uVar26;
  vVar79.field_0._0_8_ = this;
  return (vbool<4>)vVar79.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorK<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;    
    }